

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInteger.cpp
# Opt level: O1

BigInteger *
BigIntegerLibrary::gcdex
          (BigInteger *__return_storage_ptr__,BigInteger *a,BigInteger *b,BigInteger *x,
          BigInteger *y)

{
  int iVar1;
  BigInteger x1;
  BigInteger y1;
  BigInteger local_110;
  BigInteger local_f0;
  BigInteger local_d0;
  BigInteger local_b0;
  BigInteger local_90;
  BigInteger local_70;
  BigInteger local_50;
  
  iVar1 = BigInteger::compare(a,(BigInteger *)zero);
  if (iVar1 == 0) {
    if (x != (BigInteger *)zero) {
      x->isNegative = (bool)zero[0x18];
      std::vector<int,_std::allocator<int>_>::operator=
                (&x->num,(vector<int,_std::allocator<int>_> *)zero);
    }
    BigInteger::BigInteger(&local_110,1);
    if (&local_110 != y) {
      y->isNegative = local_110.isNegative;
      std::vector<int,_std::allocator<int>_>::operator=(&y->num,&local_110.num);
    }
    if (local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    BigInteger::BigInteger(__return_storage_ptr__,b);
  }
  else {
    BigInteger::BigInteger(&local_110,0);
    BigInteger::BigInteger(&local_f0,0);
    BigInteger::operator%(&local_50,b,a);
    BigInteger::BigInteger(&local_70,a);
    gcdex(__return_storage_ptr__,&local_50,&local_70,&local_110,&local_f0);
    if (local_70.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_70.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    BigInteger::operator/(&local_d0,b,a);
    BigInteger::operator*(&local_b0,&local_d0,&local_110);
    BigInteger::operator-(&local_90,&local_f0,&local_b0);
    if (&local_90 != x) {
      x->isNegative = local_90.isNegative;
      std::vector<int,_std::allocator<int>_>::operator=(&x->num,&local_90.num);
    }
    if (local_90.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_90.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_b0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_b0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (&local_110 != y) {
      y->isNegative = local_110.isNegative;
      std::vector<int,_std::allocator<int>_>::operator=(&y->num,&local_110.num);
    }
    if (local_f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BigInteger gcdex(BigInteger a, BigInteger b, BigInteger& x, BigInteger& y) {
        if (a == zero) {
            x = zero;
            y = BigInteger(1);
            return b;
        }
        BigInteger x1, y1;
        BigInteger d = gcdex(b % a, a, x1, y1);
        x = y1 - (b / a) * x1;
        y = x1;
        return d;
    }